

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

void __thiscall Am_Point_List::Get(Am_Point_List *this,int *x,int *y)

{
  int iVar1;
  int *y_local;
  int *x_local;
  Am_Point_List *this_local;
  
  if (this->item == (Am_Point_Item *)0x0) {
    Am_Error("** Am_Point_List::Get: no item is current\n");
  }
  iVar1 = iround(this->item->x);
  *x = iVar1;
  iVar1 = iround(this->item->y);
  *y = iVar1;
  return;
}

Assistant:

void
Am_Point_List::Get(int &x, int &y) const
{
  if (!item)
    Am_Error("** Am_Point_List::Get: no item is current\n");
  x = iround(item->x);
  y = iround(item->y);
}